

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcMaterialDefinitionRepresentation::IfcMaterialDefinitionRepresentation
          (IfcMaterialDefinitionRepresentation *this)

{
  IfcMaterialDefinitionRepresentation *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x90,"IfcMaterialDefinitionRepresentation");
  IfcProductRepresentation::IfcProductRepresentation
            (&this->super_IfcProductRepresentation,&PTR_construction_vtable_24__00f968a8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcMaterialDefinitionRepresentation,_1UL>::
  ObjectHelper((ObjectHelper<Assimp::IFC::Schema_2x3::IfcMaterialDefinitionRepresentation,_1UL> *)
               &(this->super_IfcProductRepresentation).field_0x78,
               &PTR_construction_vtable_24__00f968c8);
  (this->super_IfcProductRepresentation).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProductRepresentation,_3UL>._vptr_ObjectHelper =
       (_func_int **)0xf96840;
  *(undefined8 *)&this->field_0x90 = 0xf96890;
  *(undefined8 *)&(this->super_IfcProductRepresentation).field_0x78 = 0xf96868;
  STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::NotImplemented> *)
             &(this->super_IfcProductRepresentation).field_0x88,(LazyObject *)0x0);
  return;
}

Assistant:

IfcMaterialDefinitionRepresentation() : Object("IfcMaterialDefinitionRepresentation") {}